

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode
SUNLinSolSetPreconditioner_SPBCGS
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  SUNContext sunctx_local_scope_;
  SUNPSolveFn Psolve_local;
  SUNPSetupFn Psetup_local;
  void *PData_local;
  SUNLinearSolver S_local;
  
  *(SUNPSetupFn *)((long)S->content + 0x30) = Psetup;
  *(SUNPSolveFn *)((long)S->content + 0x38) = Psolve;
  *(void **)((long)S->content + 0x40) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPBCGS(SUNLinearSolver S, void* PData,
                                             SUNPSetupFn Psetup,
                                             SUNPSolveFn Psolve)
{
  SUNFunctionBegin(S->sunctx);
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPBCGS_CONTENT(S)->Psetup = Psetup;
  SPBCGS_CONTENT(S)->Psolve = Psolve;
  SPBCGS_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}